

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

bool __thiscall ON_DimStyleExtra::Write(ON_DimStyleExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_DimStyleExtra *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,3);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_parent_dimstyle);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(archive,&this->m_valid_fields);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(archive,this->m_tolerance_style);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(archive,this->m_tolerance_resolution);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_upper_value);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_lower_value);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_height_scale);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar2 < 5) {
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_baseline_spacing * this->m_dimscale);
    }
  }
  else if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_baseline_spacing);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteBool(archive,(bool)(this->m_bDrawMask & 1));
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(archive,this->m_mask_color_source);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteColor(archive,&this->m_mask_color);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar2 < 5) {
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteDouble(archive,1.0);
    }
  }
  else if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(archive,this->m_dimscale);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(archive,this->m_dimscale_source);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_source_dimstyle);
  }
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  if (!bVar1) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ON_DimStyleExtra::Write(ON_BinaryArchive& archive) const
{
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0); Changed to 1,1 for mask settings 12/12/09
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1); Changed to 1,2 for dimscale 12/17/09
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2); Changed to 1,3 for source_dimstyle 10/19/10
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,3);

  if(rc) rc = archive.WriteUuid( m_parent_dimstyle);
  if(rc) rc = archive.WriteArray( m_valid_fields);

  if(rc) rc = archive.WriteInt(m_tolerance_style);
  if(rc) rc = archive.WriteInt(m_tolerance_resolution);

  if(rc) rc = archive.WriteDouble(m_tolerance_upper_value);
  if(rc) rc = archive.WriteDouble(m_tolerance_lower_value);
  if(rc) rc = archive.WriteDouble(m_tolerance_height_scale);

  // March 22, 2010 - Global DimStyle was obsoleted and moved into DimStyles
  // So now for writing older version files, its multiplied into all distance values
  if(archive.Archive3dmVersion() < 5)
  {
    if(rc) rc = archive.WriteDouble(m_baseline_spacing * m_dimscale);
  }
  else
  {
    if(rc) rc = archive.WriteDouble(m_baseline_spacing);
  }

  if(rc) rc = archive.WriteBool(m_bDrawMask);
  if(rc) rc = archive.WriteInt(m_mask_color_source);
  if(rc) rc = archive.WriteColor(m_mask_color);

  if(archive.Archive3dmVersion() < 5)
  {
    if(rc) rc = archive.WriteDouble(1.0);
  }
  else
  {
    if(rc) rc = archive.WriteDouble(m_dimscale);
  }
  if(rc) rc = archive.WriteInt(m_dimscale_source); // Obsolete field

  if(rc) rc = archive.WriteUuid(m_source_dimstyle);  // Added 19 Oct 2010

  if(!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}